

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O1

int asciiToUTF8(uchar *out,int *outlen,uchar *in,int *inlen)

{
  uchar *puVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  uchar *puVar6;
  int iVar7;
  long lVar8;
  uchar *puVar9;
  
  iVar7 = (int)in;
  iVar2 = *inlen;
  puVar9 = out;
  iVar5 = iVar7;
  if (0 < (long)iVar2) {
    iVar3 = *outlen;
    lVar8 = 0;
    puVar6 = in;
    do {
      iVar5 = (int)puVar6;
      if ((long)*outlen <= lVar8 + 5) goto LAB_001449a6;
      puVar1 = out + lVar8;
      iVar5 = (int)lVar8;
      if (out + iVar3 <= puVar1) {
        iVar5 = iVar5 + iVar7;
        puVar9 = puVar1;
        goto LAB_001449a6;
      }
      if ((char)in[lVar8] < '\0') {
        *outlen = iVar5;
        *inlen = iVar5;
        return -1;
      }
      puVar6 = puVar6 + 1;
      iVar5 = (int)puVar6;
      puVar9 = puVar9 + 1;
      *puVar1 = in[lVar8];
      lVar4 = lVar8 + 1;
      lVar8 = lVar8 + 1;
    } while (in + lVar4 < in + iVar2);
    puVar9 = out + lVar8;
  }
LAB_001449a6:
  *outlen = (int)puVar9 - (int)out;
  *inlen = iVar5 - iVar7;
  return *outlen;
}

Assistant:

static int
asciiToUTF8(unsigned char* out, int *outlen,
              const unsigned char* in, int *inlen) {
    unsigned char* outstart = out;
    const unsigned char* base = in;
    const unsigned char* processed = in;
    unsigned char* outend = out + *outlen;
    const unsigned char* inend;
    unsigned int c;

    inend = in + (*inlen);
    while ((in < inend) && (out - outstart + 5 < *outlen)) {
	c= *in++;

        if (out >= outend)
	    break;
        if (c < 0x80) {
	    *out++ = c;
	} else {
	    *outlen = out - outstart;
	    *inlen = processed - base;
	    return(-1);
	}

	processed = (const unsigned char*) in;
    }
    *outlen = out - outstart;
    *inlen = processed - base;
    return(*outlen);
}